

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_3UL> kj::hex(uchar i)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  undefined7 in_register_00000039;
  bool bVar8;
  CappedArray<char,_3UL> CVar9;
  uint8_t reverse [2];
  CappedArray<char,_3UL> result;
  
  uVar6 = CONCAT71(in_register_00000039,i);
  result.currentSize = 3;
  reverse[0] = '\0';
  reverse[1] = '\0';
  if ((int)uVar6 == 0) {
    pbVar5 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
  }
  else {
    pbVar5 = reverse;
    uVar2 = uVar6 & 0xffffffff;
    do {
      bVar1 = (byte)uVar6;
      *pbVar5 = bVar1 & 0xf;
      pbVar5 = pbVar5 + 1;
      uVar2 = uVar2 >> 4 & 0xf;
      uVar6 = uVar2;
    } while (0xf < bVar1);
    pcVar4 = result.content;
    if (pbVar5 <= reverse) {
      uVar6 = 0;
      goto LAB_004ab679;
    }
  }
  pbVar7 = pbVar5 + 9;
  pcVar3 = result.content;
  do {
    pbVar5 = pbVar5 + -1;
    *pcVar3 = "0123456789abcdef"[*pbVar5];
    pcVar4 = pcVar3 + 1;
    bVar8 = (byte *)pcVar3 != pbVar7;
    pcVar3 = pcVar4;
  } while (bVar8);
  uVar6 = (ulong)(result._8_4_ & 0xffffff);
LAB_004ab679:
  CVar9.currentSize = (long)pcVar4 - (long)result.content;
  CVar9.content[0] = (char)uVar6;
  CVar9.content[1] = (char)(uVar6 >> 8);
  CVar9.content[2] = (char)(uVar6 >> 0x10);
  CVar9._11_5_ = (int5)(uVar6 >> 0x18);
  return CVar9;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}